

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O1

SmallBuffer * helics::typeConvert(SmallBuffer *__return_storage_ptr__,DataType type,string_view val)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  value_t vVar2;
  json_value jVar3;
  _Alloc_hider __src;
  string *val_00;
  reference pvVar4;
  const_iterator pvVar5;
  char *pcVar6;
  helics *this;
  ulong uVar7;
  NamedPoint *val_01;
  double dVar8;
  string_view val_02;
  string_view val_03;
  json json;
  NamedPoint local_98;
  data local_70;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  double local_50;
  data local_48;
  data local_38;
  
  pcVar6 = val._M_str;
  this = (helics *)val._M_len;
  val_01 = &local_98;
  local_60._M_len = (size_t)this;
  local_60._M_str = pcVar6;
  if (this == (helics *)0x0) {
    emptyBlock(__return_storage_ptr__,type,HELICS_ANY);
    return __return_storage_ptr__;
  }
  switch(type) {
  case HELICS_DOUBLE:
    local_98.name._M_dataplus._M_p = (pointer)getDoubleFromString(val);
    ValueConverter<double>::convert(__return_storage_ptr__,(double *)&local_98);
    return __return_storage_ptr__;
  case HELICS_INT:
    dVar8 = getDoubleFromString(val);
    local_98.name._M_dataplus._M_p = (pointer)(long)dVar8;
    goto LAB_00297441;
  case HELICS_COMPLEX:
    helicsGetComplex(val);
    ValueConverter<std::complex<double>_>::convert
              (__return_storage_ptr__,(complex<double> *)&local_98);
    return __return_storage_ptr__;
  case HELICS_VECTOR:
    val_03._M_str = (char *)&switchD_00297105::switchdataD_00448b7c;
    val_03._M_len = (size_t)pcVar6;
    helicsGetVector((vector<double,_std::allocator<double>_> *)&local_98,this,val_03);
    ValueConverter<std::vector<double,_std::allocator<double>_>_>::convert
              (__return_storage_ptr__,(vector<double,_std::allocator<double>_> *)&local_98);
    break;
  case HELICS_COMPLEX_VECTOR:
    val_02._M_str = (char *)&switchD_00297105::switchdataD_00448b7c;
    val_02._M_len = (size_t)pcVar6;
    helicsGetComplexVector
              ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&local_98,
               this,val_02);
    ValueConverter<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>::
    convert(__return_storage_ptr__,
            (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&local_98);
    break;
  case HELICS_NAMED_POINT:
    local_50 = nan("0");
    paVar1 = &local_98.name.field_2;
    local_98.name._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,pcVar6,this + (long)pcVar6);
    local_98.value = local_50;
    ValueConverter<helics::NamedPoint>::convert(__return_storage_ptr__,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.name._M_dataplus._M_p == paVar1) {
      return __return_storage_ptr__;
    }
    uVar7 = local_98.name.field_2._M_allocated_capacity + 1;
    goto LAB_002973e5;
  case HELICS_BOOL:
    local_98.name._M_dataplus._M_p = (pointer)this;
    local_98.name._M_string_length = (size_type)pcVar6;
    pvVar5 = frozen::
             unordered_map<std::basic_string_view<char,std::char_traits<char>>,bool,37ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
             ::
             find<std::basic_string_view<char,std::char_traits<char>>,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
                       ((unordered_map<std::basic_string_view<char,std::char_traits<char>>,bool,37ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
                         *)&helicsBoolValue::knownStrings,
                        (basic_string_view<char,_std::char_traits<char>_> *)&local_98,
                        (elsa<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                        &helicsBoolValue::knownStrings.tables_.field_0x408,
                        (equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                        &helicsBoolValue::knownStrings);
    if ((tables_type *)pvVar5 == &helicsBoolValue::knownStrings.tables_) {
      local_98.name._M_string_length = 0x465755;
    }
    else {
      local_98.name._M_string_length = 0x45e053;
      if (pvVar5->second != false) {
        local_98.name._M_string_length = 0x465755;
      }
    }
    local_98.name._M_dataplus._M_p = (pointer)0x1;
    goto LAB_00297460;
  case HELICS_TIME:
    dVar8 = getDoubleFromString(val);
    if (dVar8 <= -9223372036.854765) {
      local_98.name._M_dataplus._M_p = (pointer)0x8000000000000001;
    }
    else {
      local_98.name._M_dataplus._M_p = (pointer)0x7fffffffffffffff;
      if (dVar8 < 9223372036.854765) {
        local_98.name._M_dataplus._M_p =
             (pointer)(long)(dVar8 * 1000000000.0 +
                            *(double *)(&DAT_00421040 + (ulong)(0.0 <= dVar8 * 1000000000.0) * 8));
      }
    }
LAB_00297441:
    ValueConverter<long>::convert(__return_storage_ptr__,(long *)&local_98);
    return __return_storage_ptr__;
  default:
    if (type == HELICS_JSON) {
      local_70.m_type = null;
      local_70.m_value.object = (object_t *)0x0;
      val_00 = typeNameStringRef_abi_cxx11_(HELICS_STRING);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_38,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)val_00);
      pvVar4 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&local_70,"type");
      vVar2 = (pvVar4->m_data).m_type;
      (pvVar4->m_data).m_type = local_38.m_type;
      jVar3 = (pvVar4->m_data).m_value;
      (pvVar4->m_data).m_value = local_38.m_value;
      local_38.m_type = vVar2;
      local_38.m_value = jVar3;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_38);
      paVar1 = &local_98.name.field_2;
      local_98.name._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_98,local_60._M_str,
                 (helics *)(local_60._M_len + (long)local_60._M_str));
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_48,&local_98.name);
      pvVar4 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&local_70,"value");
      vVar2 = (pvVar4->m_data).m_type;
      (pvVar4->m_data).m_type = local_48.m_type;
      jVar3 = (pvVar4->m_data).m_value;
      (pvVar4->m_data).m_value = local_48.m_value;
      local_48.m_type = vVar2;
      local_48.m_value = jVar3;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98.name._M_dataplus._M_p != paVar1) {
        operator_delete(local_98.name._M_dataplus._M_p,
                        local_98.name.field_2._M_allocated_capacity + 1);
      }
      fileops::generateJsonString(&local_98.name,(json *)&local_70,true);
      __src._M_p = local_98.name._M_dataplus._M_p;
      (__return_storage_ptr__->buffer)._M_elems[0x30] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x31] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x32] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x33] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x34] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x35] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x36] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x37] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x38] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x39] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x3a] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x3b] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x3c] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x3d] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x3e] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x3f] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x20] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x21] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x22] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x23] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x24] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x25] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x26] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x27] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x28] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x29] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x2a] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x2b] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x2c] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x2d] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x2e] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x2f] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x10] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x11] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x12] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x13] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x14] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x15] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x16] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x17] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x18] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x19] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x1a] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x1b] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x1c] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x1d] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x1e] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x1f] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0] = 0;
      (__return_storage_ptr__->buffer)._M_elems[1] = 0;
      (__return_storage_ptr__->buffer)._M_elems[2] = 0;
      (__return_storage_ptr__->buffer)._M_elems[3] = 0;
      (__return_storage_ptr__->buffer)._M_elems[4] = 0;
      (__return_storage_ptr__->buffer)._M_elems[5] = 0;
      (__return_storage_ptr__->buffer)._M_elems[6] = 0;
      (__return_storage_ptr__->buffer)._M_elems[7] = 0;
      (__return_storage_ptr__->buffer)._M_elems[8] = 0;
      (__return_storage_ptr__->buffer)._M_elems[9] = 0;
      (__return_storage_ptr__->buffer)._M_elems[10] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0xb] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0xc] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0xd] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0xe] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0xf] = 0;
      __return_storage_ptr__->bufferSize = 0;
      __return_storage_ptr__->bufferCapacity = 0x40;
      __return_storage_ptr__->heap = (byte *)__return_storage_ptr__;
      __return_storage_ptr__->nonOwning = false;
      __return_storage_ptr__->locked = false;
      __return_storage_ptr__->usingAllocatedBuffer = false;
      __return_storage_ptr__->errorCondition = '\0';
      __return_storage_ptr__->userKey = 0;
      SmallBuffer::reserve(__return_storage_ptr__,local_98.name._M_string_length);
      __return_storage_ptr__->bufferSize = local_98.name._M_string_length;
      memcpy(__return_storage_ptr__->heap,__src._M_p,local_98.name._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98.name._M_dataplus._M_p != paVar1) {
        operator_delete(local_98.name._M_dataplus._M_p,
                        local_98.name.field_2._M_allocated_capacity + 1);
      }
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_70);
      return __return_storage_ptr__;
    }
    val_01 = (NamedPoint *)&local_60;
LAB_00297460:
    ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert
              (__return_storage_ptr__,(basic_string_view<char,_std::char_traits<char>_> *)val_01);
    return __return_storage_ptr__;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.name._M_dataplus._M_p ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    return __return_storage_ptr__;
  }
  uVar7 = local_98.name.field_2._M_allocated_capacity - (long)local_98.name._M_dataplus._M_p;
LAB_002973e5:
  operator_delete(local_98.name._M_dataplus._M_p,uVar7);
  return __return_storage_ptr__;
}

Assistant:

SmallBuffer typeConvert(DataType type, std::string_view val)
{
    if (val.empty()) {
        return emptyBlock(type);
    }

    switch (type) {
        case DataType::HELICS_DOUBLE:
            return ValueConverter<double>::convert(getDoubleFromString(val));
        case DataType::HELICS_INT:
            return ValueConverter<int64_t>::convert(static_cast<int64_t>(getDoubleFromString(val)));
        case DataType::HELICS_TIME:
            return ValueConverter<int64_t>::convert(
                Time(getDoubleFromString(val)).getBaseTimeCode());
        case DataType::HELICS_COMPLEX:
            return ValueConverter<std::complex<double>>::convert(helicsGetComplex(val));
        case DataType::HELICS_BOOL:
            return ValueConverter<std::string_view>::convert((helicsBoolValue(val)) ? "1" : "0");
        case DataType::HELICS_STRING:
        case DataType::HELICS_CHAR:
        default:
            return ValueConverter<std::string_view>::convert(val);
        case DataType::HELICS_NAMED_POINT:
            return ValueConverter<NamedPoint>::convert(NamedPoint{val, std::nan("0")});
        case DataType::HELICS_COMPLEX_VECTOR:
            return ValueConverter<std::vector<std::complex<double>>>::convert(
                helicsGetComplexVector(val));
        case DataType::HELICS_VECTOR:
            return ValueConverter<std::vector<double>>::convert(helicsGetVector(val));
        case DataType::HELICS_JSON: {
            nlohmann::json json;
            json["type"] = typeNameStringRef(DataType::HELICS_STRING);
            json["value"] = std::string(val);
            return fileops::generateJsonString(json);
        }
    }
}